

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

int32_t lj_lib_checkint(lua_State *L,int narg)

{
  int iVar1;
  long lVar2;
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  int32_t i;
  TValue *o;
  ushort in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  
  lVar2 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  L_00 = (lua_State *)(lVar2 + -8);
  if (L_00 < *(lua_State **)(in_RDI + 0x18)) {
    in_stack_ffffffffffffffdb = true;
    if ((0xfffeffff < *(uint *)(lVar2 + -4)) &&
       (in_stack_ffffffffffffffda = false, in_stack_ffffffffffffffdb = in_stack_ffffffffffffffda,
       *(int *)(lVar2 + -4) == -5)) {
      iVar1 = lj_strscan_num((GCstr *)L_00,
                             (TValue *)
                             CONCAT44(in_stack_ffffffffffffffdc,
                                      CONCAT13(1,(uint3)in_stack_ffffffffffffffd8)));
      in_stack_ffffffffffffffda = iVar1 != 0;
      in_stack_ffffffffffffffdb = in_stack_ffffffffffffffda;
    }
    if ((bool)in_stack_ffffffffffffffdb != false) {
      return (int)*(double *)L_00;
    }
  }
  lj_err_argt(L_00,in_stack_ffffffffffffffdc,
              CONCAT13(in_stack_ffffffffffffffdb,
                       CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)));
}

Assistant:

int32_t lj_lib_checkint(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top && lj_strscan_numberobj(o)))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else {
    int32_t i = lj_num2int(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return i;
  }
}